

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

size_t helics::detail::convertToBinary
                 (byte *data,
                 vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  pointer __src;
  pointer pcVar1;
  long lVar2;
  
  lVar2 = (long)(val->
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(val->
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                _M_impl.super__Vector_impl_data._M_start >> 4;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  *data = 0x62;
  data[3] = 0;
  data[4] = (byte)((ulong)lVar2 >> 0x18);
  data[5] = (byte)((ulong)lVar2 >> 0x10);
  data[6] = (byte)((ulong)lVar2 >> 8);
  data[7] = (byte)lVar2;
  __src = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
          _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__src != pcVar1) {
    memcpy(data + 8,__src,(long)pcVar1 - (long)__src);
  }
  return (long)(val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish +
         (8 - (long)(val->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

size_t convertToBinary(std::byte* data, const std::vector<std::complex<double>>& val)
{
    addCodeAndSize(data, cvCode, val.size());
    if (!val.empty()) {
        std::memcpy(data + 8, val.data(), val.size() * sizeof(double) * 2);
    }
    return val.size() * sizeof(double) * 2U + 8U;
}